

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O3

void duckdb::ReadDataFromVarcharSegment
               (ListSegmentFunctions *param_1,ListSegment *segment,Vector *result,idx_t *total_count
               )

{
  uint *puVar1;
  idx_t iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  Vector *vector;
  byte bVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  data_ptr_t pdVar6;
  uint uVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  InternalException *this_00;
  char *pcVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  ulong __n;
  ulong uVar11;
  char *pcVar12;
  Vector *pVVar13;
  ulong uVar14;
  long lVar15;
  anon_struct_16_3_d7536bce_for_pointer aVar16;
  string local_98;
  buffer_ptr<ValidityBuffer> *local_78;
  ListSegment *local_70;
  Vector *local_68;
  idx_t *local_60;
  char *local_58;
  data_ptr_t local_50;
  char *local_48;
  ListSegment *local_40;
  idx_t local_38;
  
  FlatVector::VerifyFlatVector(result);
  if (segment->count != 0) {
    local_50 = result->data;
    local_40 = segment + 1;
    pcVar10 = (char *)((long)&segment[1].count + (ulong)segment->capacity);
    lVar15 = *(long *)((long)&segment[1].next + (ulong)segment->capacity * 9);
    local_78 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar14 = 0;
    uVar11 = 0;
    local_70 = segment;
    local_68 = result;
    local_60 = total_count;
    local_58 = pcVar10;
    do {
      pdVar6 = local_50;
      iVar2 = *total_count;
      if (*(char *)((long)&local_40->count + uVar11) == '\x01') {
        _Var9._M_head_impl =
             (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var9._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_98,&local_38);
          sVar5 = local_98._M_string_length;
          _Var4._M_p = local_98._M_dataplus._M_p;
          local_98._M_dataplus._M_p = (pointer)0x0;
          local_98._M_string_length = 0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)_Var4._M_p;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_78);
          _Var9._M_head_impl =
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var9._M_head_impl;
        }
        bVar3 = (byte)(iVar2 + uVar11) & 0x3f;
        pcVar10 = (char *)(-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        _Var9._M_head_impl[iVar2 + uVar11 >> 6] =
             _Var9._M_head_impl[iVar2 + uVar11 >> 6] & (ulong)pcVar10;
      }
      else {
        puVar1 = (uint *)(local_50 + uVar11 * 0x10 + iVar2 * 0x10);
        vector = *(Vector **)(local_58 + uVar11 * 8);
        aVar16 = (anon_struct_16_3_d7536bce_for_pointer)
                 StringVector::EmptyString((StringVector *)result,vector,(idx_t)pcVar10);
        pcVar12 = (((anon_union_16_2_67f50693_for_value *)(pdVar6 + uVar11 * 0x10 + iVar2 * 0x10))->
                  pointer).prefix;
        ((anon_union_16_2_67f50693_for_value *)(pdVar6 + uVar11 * 0x10 + iVar2 * 0x10))->pointer =
             aVar16;
        pcVar10 = aVar16.ptr;
        if (aVar16.length < 0xd) {
          pcVar10 = pcVar12;
        }
        if (vector != (Vector *)0x0) {
          pVVar13 = (Vector *)0x0;
          local_48 = pcVar12;
          do {
            if (lVar15 == 0) {
              this_00 = (InternalException *)__cxa_allocate_exception(0x10);
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_98,"Insufficient data to read string","");
              InternalException::InternalException(this_00,&local_98);
              __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            __n = *(ushort *)(lVar15 + 2) - uVar14;
            if ((ulong)((long)vector - (long)pVVar13) < __n) {
              __n = (long)vector - (long)pVVar13;
            }
            switchD_015de399::default(pcVar10 + (long)pVVar13,(void *)(lVar15 + uVar14 + 0x10),__n);
            uVar14 = uVar14 + __n;
            if (*(ushort *)(lVar15 + 2) <= uVar14) {
              lVar15 = *(long *)(lVar15 + 8);
              uVar14 = 0;
            }
            pVVar13 = (Vector *)(&pVVar13->vector_type + __n);
          } while (pVVar13 < vector);
          aVar16.prefix[0] = '\0';
          aVar16.prefix[1] = '\0';
          aVar16.prefix[2] = '\0';
          aVar16.prefix[3] = '\0';
          aVar16.length = *puVar1;
          aVar16.ptr = extraout_RDX;
          pcVar12 = local_48;
        }
        total_count = local_60;
        result = local_68;
        segment = local_70;
        pcVar10 = aVar16.ptr;
        uVar7 = aVar16.length;
        if (uVar7 < 0xd) {
          switchD_01043a80::default(pcVar12 + uVar7,0,0xc - (ulong)uVar7);
          pcVar10 = extraout_RDX_00;
        }
        else {
          puVar1[1] = **(uint **)(puVar1 + 2);
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < segment->count);
  }
  return;
}

Assistant:

static void ReadDataFromVarcharSegment(const ListSegmentFunctions &, const ListSegment *segment, Vector &result,
                                       idx_t &total_count) {
	auto &aggr_vector_validity = FlatVector::Validity(result);

	// use length and (reconstructed) offset to get the correct substrings
	auto aggr_vector_data = FlatVector::GetData<string_t>(result);
	auto str_length_data = GetListLengthData(segment);

	auto null_mask = GetNullMask(segment);
	auto linked_child_list = Load<LinkedList>(const_data_ptr_cast(GetListChildData(segment)));
	auto current_segment = linked_child_list.first_segment;
	idx_t child_offset = 0;
	for (idx_t i = 0; i < segment->count; i++) {
		if (null_mask[i]) {
			// set to null
			aggr_vector_validity.SetInvalid(total_count + i);
			continue;
		}
		// read the string
		auto &result_str = aggr_vector_data[total_count + i];
		auto str_length = Load<uint64_t>(const_data_ptr_cast(str_length_data + i));
		// allocate an empty string for the given size
		result_str = StringVector::EmptyString(result, str_length);
		auto result_data = result_str.GetDataWriteable();
		// copy over the data
		idx_t current_offset = 0;
		while (current_offset < str_length) {
			if (!current_segment) {
				throw InternalException("Insufficient data to read string");
			}
			auto child_data = GetStringData(current_segment);
			idx_t max_copy = MinValue<idx_t>(str_length - current_offset, current_segment->capacity - child_offset);
			memcpy(result_data + current_offset, child_data + child_offset, max_copy);
			current_offset += max_copy;
			child_offset += max_copy;
			if (child_offset >= current_segment->capacity) {
				D_ASSERT(child_offset == current_segment->capacity);
				current_segment = current_segment->next;
				child_offset = 0;
			}
		}

		// finalize the str
		result_str.Finalize();
	}
}